

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::pawn_quiets(Movegen *this,U64 *single,U64 *dbl)

{
  Color CVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  
  if (this->pawns != 0) {
    CVar1 = this->us;
    *single = this->pawns & *(ulong *)(bitboards::pawnmask + (ulong)CVar1 * 8);
    *dbl = this->rank2 & this->pawns;
    pcVar3 = anon_unknown.dwarf_812ac::shift<(Dir)1>;
    if ((ulong)CVar1 == 0) {
      pcVar3 = anon_unknown.dwarf_812ac::shift<(Dir)0>;
    }
    (*pcVar3)(single);
    *single = *single & this->qtarget;
    iVar2 = 2;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      (*pcVar3)(dbl);
      *dbl = *dbl & this->empty;
    }
    if (this->evasion_target != 0) {
      *dbl = *dbl & this->evasion_target;
    }
  }
  return;
}

Assistant:

inline void Movegen::pawn_quiets(U64& single, U64& dbl) {

	if (pawns == 0ULL) return;

	single = pawns & bitboards::pawnmask[us]; // filter the promotion candidates  
	dbl = pawns & rank2;

	auto s = (us == white ? shift<N> : shift<S>);

	s(single);
	single &= qtarget;

	for (int i = 0; i < 2; ++i) {
		s(dbl);
		dbl &= empty;
	}
	if (evasion_target != 0ULL) dbl &= evasion_target;
}